

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<std::array<unsigned_int,_2UL>_> *value)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  uint2 v;
  storage_t<std::array<unsigned_int,_2UL>_> local_18;
  
  local_18._1_7_ = in_register_00000001;
  local_18._0_1_ = in_AL;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ParseBasicTypeTuple<unsigned_int,2ul>(this,(array<unsigned_int,_2UL> *)&local_18);
    if (bVar1) {
      if (value->has_value_ == false) {
        value->has_value_ = true;
      }
      value->contained = local_18;
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::uint2> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::uint2 v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}